

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O1

void njd_set_digit(NJD *njd)

{
  char *__nptr;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  NJDNode *s;
  NJDNode *pNVar4;
  char **ppcVar5;
  _NJDNode *p_Var6;
  _NJDNode **pp_Var7;
  NJDNode *pNVar8;
  long lVar9;
  bool bVar10;
  
  pNVar8 = njd->head;
  if (pNVar8 != (NJDNode *)0x0) {
    bVar10 = false;
    pNVar4 = (NJDNode *)0x0;
    s = (NJDNode *)0x0;
    do {
      bVar1 = !bVar10;
      bVar10 = true;
      if (bVar1) {
        pcVar3 = NJDNode_get_pos_group1(pNVar8);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
        bVar10 = iVar2 == 0;
      }
      iVar2 = get_digit(pNVar8,1);
      if (iVar2 < 0) {
        pcVar3 = NJDNode_get_pos_group1(pNVar8);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_string(pNVar8);
          iVar2 = is_period(pcVar3);
          if ((iVar2 != 0) ||
             ((pcVar3 = NJDNode_get_string(pNVar8), pcVar3 != (char *)0x0 &&
              (iVar2 = strcmp(pcVar3,anon_var_dwarf_1bf0), iVar2 == 0)))) goto LAB_001489a9;
        }
        if (s == (NJDNode *)0x0) {
          s = (NJDNode *)0x0;
        }
        else {
          pNVar4 = pNVar8->prev;
        }
      }
      else {
LAB_001489a9:
        if (s == (NJDNode *)0x0) {
          s = pNVar8;
        }
        if (pNVar8 == njd->tail) {
          pNVar4 = pNVar8;
        }
      }
      if ((s != (NJDNode *)0x0) && (pNVar4 != (NJDNode *)0x0)) {
        convert_digit_sequence(njd,s,pNVar4);
        s = (NJDNode *)0x0;
        pNVar4 = (NJDNode *)0x0;
      }
      pNVar8 = pNVar8->next;
    } while (pNVar8 != (_NJDNode *)0x0);
    if (bVar10) {
      NJD_remove_silent_node(njd);
      if (njd->head != (NJDNode *)0x0) {
        pNVar8 = njd->head->next;
joined_r0x00148a66:
        do {
          if ((pNVar8 == (NJDNode *)0x0) || (pNVar8->next == (_NJDNode *)0x0)) goto LAB_00148c59;
          pcVar3 = NJDNode_get_string(pNVar8);
          iVar2 = strcmp(pcVar3,"*");
          if (iVar2 != 0) {
            pcVar3 = NJDNode_get_string(pNVar8->prev);
            iVar2 = strcmp(pcVar3,"*");
            if (iVar2 != 0) {
              pcVar3 = NJDNode_get_string(pNVar8);
              iVar2 = is_period(pcVar3);
              if (iVar2 != 0) {
                pcVar3 = NJDNode_get_pos_group1(pNVar8->prev);
                iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
                if (iVar2 == 0) {
                  pcVar3 = NJDNode_get_pos_group1(pNVar8->next);
                  iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
                  if (iVar2 == 0) {
                    NJDNode_load(pNVar8,anon_var_dwarf_1296a8);
                    NJDNode_set_chain_flag(pNVar8,1);
                    pcVar3 = NJDNode_get_string(pNVar8->prev);
                    iVar2 = strcmp(pcVar3,anon_var_dwarf_1296bf);
                    if (iVar2 == 0) {
LAB_00148bd5:
                      pNVar4 = pNVar8->prev;
                      pcVar3 = anon_var_dwarf_1296d5;
LAB_00148be0:
                      NJDNode_set_pron(pNVar4,pcVar3);
                      NJDNode_set_mora_size(pNVar8->prev,2);
                    }
                    else {
                      pcVar3 = NJDNode_get_string(pNVar8->prev);
                      iVar2 = strcmp(pcVar3,anon_var_dwarf_1c40);
                      if (iVar2 == 0) goto LAB_00148bd5;
                      pcVar3 = NJDNode_get_string(pNVar8->prev);
                      iVar2 = strcmp(pcVar3,anon_var_dwarf_1296ec);
                      pNVar4 = pNVar8->prev;
                      if (iVar2 == 0) {
                        pcVar3 = anon_var_dwarf_12ae07 + 3;
                        goto LAB_00148be0;
                      }
                      pcVar3 = NJDNode_get_string(pNVar4);
                      iVar2 = strcmp(pcVar3,anon_var_dwarf_129702);
                      pNVar4 = pNVar8->prev;
                      if (iVar2 == 0) {
                        pcVar3 = anon_var_dwarf_12970d;
                        goto LAB_00148be0;
                      }
                      pcVar3 = NJDNode_get_string(pNVar4);
                      iVar2 = strcmp(pcVar3,anon_var_dwarf_129718);
                      if (iVar2 == 0) {
                        NJDNode_set_acc(pNVar8->prev,1);
                      }
                    }
                    p_Var6 = pNVar8->next;
                    if (p_Var6 == (_NJDNode *)0x0) {
                      pNVar8 = (NJDNode *)0x0;
                    }
                    else {
                      do {
                        pcVar3 = NJDNode_get_pos(p_Var6);
                        iVar2 = strcmp(pcVar3,anon_var_dwarf_12ee52 + 0xd);
                        p_Var6 = p_Var6->next;
                        pNVar8 = p_Var6;
                        if (iVar2 != 0) break;
                        pNVar8 = (NJDNode *)0x0;
                      } while (p_Var6 != (NJDNode *)0x0);
                    }
                    goto joined_r0x00148a66;
                  }
                }
              }
            }
          }
          pNVar8 = pNVar8->next;
        } while( true );
      }
    }
  }
  return;
LAB_00148c59:
  for (pNVar8 = njd->head->next; pNVar8 != (NJDNode *)0x0; pNVar8 = pNVar8->next) {
    pcVar3 = NJDNode_get_pos_group1(pNVar8->prev);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
    if (iVar2 == 0) {
      pcVar3 = NJDNode_get_pos_group2(pNVar8);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12972e);
      if (iVar2 != 0) {
        pcVar3 = NJDNode_get_pos_group1(pNVar8);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_129745);
        if (iVar2 != 0) goto LAB_00148eb4;
      }
      iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1b,pNVar8);
      ppcVar5 = njd_set_digit_rule_conv_table1b;
      if (iVar2 == 0) {
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1c1,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1c1;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1c2,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1c2;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1d,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1d;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1e,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1e;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1f,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1f;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1g,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1g;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1h,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1h;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1i,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1i;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1j,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1j;
        if (iVar2 != 0) goto LAB_00148e09;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class1k,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table1k;
        if (iVar2 != 0) goto LAB_00148e09;
      }
      else {
LAB_00148e09:
        convert_digit_pron(ppcVar5,pNVar8->prev);
      }
      iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class2b,pNVar8);
      ppcVar5 = njd_set_digit_rule_conv_table2b;
      if (iVar2 == 0) {
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class2c,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table2c;
        if (iVar2 != 0) goto LAB_00148e90;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class2d,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table2d;
        if (iVar2 != 0) goto LAB_00148e90;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class2e,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table2e;
        if (iVar2 != 0) goto LAB_00148e90;
        iVar2 = search_numerative_class(njd_set_digit_rule_numerative_class2f,pNVar8);
        ppcVar5 = njd_set_digit_rule_conv_table2f;
        if (iVar2 != 0) goto LAB_00148e90;
      }
      else {
LAB_00148e90:
        convert_numerative_pron(ppcVar5,pNVar8->prev,pNVar8);
      }
      NJDNode_set_chain_flag(pNVar8->prev,0);
      NJDNode_set_chain_flag(pNVar8,1);
    }
LAB_00148eb4:
  }
  p_Var6 = njd->head->next;
  if (p_Var6 != (_NJDNode *)0x0) {
LAB_00148ee6:
    pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
    if (iVar2 == 0) {
      pcVar3 = NJDNode_get_pos_group1(p_Var6);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
      if (((iVar2 == 0) && (pcVar3 = NJDNode_get_string(p_Var6->prev), pcVar3 != (char *)0x0)) &&
         (pcVar3 = NJDNode_get_string(p_Var6), pcVar3 != (char *)0x0)) {
        lVar9 = 0;
        do {
          pcVar3 = NJDNode_get_string(p_Var6->prev);
          iVar2 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar9));
          if (iVar2 == 0) {
            lVar9 = 0;
            goto LAB_00148fe4;
          }
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x60);
        goto LAB_0014900a;
      }
      goto LAB_00148f19;
    }
    goto LAB_00148f85;
  }
LAB_00149083:
  p_Var6 = njd->head;
  if (p_Var6 != (NJDNode *)0x0) {
LAB_001490a4:
    if (p_Var6->next != (NJDNode *)0x0) {
      pcVar3 = NJDNode_get_string(p_Var6->next);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) goto LAB_001490d8;
      pcVar3 = NJDNode_get_pos_group1(p_Var6);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
      if (iVar2 != 0) goto LAB_001490d8;
      if (p_Var6->prev != (NJDNode *)0x0) {
        pcVar3 = NJDNode_get_pos(p_Var6->prev);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_127dd3);
        if (iVar2 != 0) {
          pcVar3 = NJDNode_get_pos_group1(p_Var6->prev);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
          if (iVar2 == 0) goto LAB_001490d8;
        }
      }
      pcVar3 = NJDNode_get_pos_group2(p_Var6->next);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12972e);
      if (iVar2 != 0) {
        pcVar3 = NJDNode_get_pos_group1(p_Var6->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_129745);
        if (iVar2 != 0) goto LAB_001490d8;
      }
      lVar9 = 1;
      do {
        pcVar3 = NJDNode_get_string(p_Var6->next);
        iVar2 = strcmp(pcVar3,*(char **)(&UNK_00175508 + lVar9 * 8));
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_read(p_Var6->next);
          iVar2 = strcmp(pcVar3,njd_set_digit_rule_numerative_class3[lVar9]);
          if (iVar2 == 0) {
            lVar9 = 0;
            goto LAB_001491e7;
          }
        }
        lVar9 = lVar9 + 2;
      } while (lVar9 != 0x7d);
      goto LAB_0014919a;
    }
    goto LAB_001490d8;
  }
LAB_001493d4:
  pNVar8 = njd->head;
  do {
    if (pNVar8 == (NJDNode *)0x0) {
      NJD_remove_silent_node(njd);
      return;
    }
    if (pNVar8->prev == (NJDNode *)0x0) {
LAB_00149416:
      if ((pNVar8->next != (_NJDNode *)0x0) && (pNVar8->next->next != (_NJDNode *)0x0)) {
        pp_Var7 = &pNVar8->next;
        pcVar3 = NJDNode_get_string(pNVar8);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_1297b5);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_string(*pp_Var7);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_1297c0);
          if (iVar2 != 0) goto LAB_00149469;
          pcVar3 = NJDNode_get_string((*pp_Var7)->next);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_129772);
          if (iVar2 == 0) {
            pcVar3 = anon_var_dwarf_1297cb;
          }
          else {
            pcVar3 = NJDNode_get_string((*pp_Var7)->next);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_1297aa);
            if (iVar2 != 0) goto LAB_00149611;
            pcVar3 = anon_var_dwarf_1297e2;
          }
          goto LAB_001495f2;
        }
LAB_00149469:
        pcVar3 = NJDNode_get_string(pNVar8);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_1296ec);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_string(*pp_Var7);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_1297b5);
          if (iVar2 == 0) {
            pcVar3 = NJDNode_get_string((*pp_Var7)->next);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_129772);
            if (iVar2 == 0) {
              pcVar3 = anon_var_dwarf_1297f9;
LAB_001495f2:
              NJDNode_load(pNVar8,pcVar3);
              NJDNode_set_pron(pNVar8->next,(char *)0x0);
            }
            else {
              pcVar3 = NJDNode_get_string((*pp_Var7)->next);
              iVar2 = strcmp(pcVar3,anon_var_dwarf_1297aa);
              if (iVar2 == 0) {
                pcVar3 = anon_var_dwarf_129804;
                goto LAB_001495f2;
              }
              pcVar3 = NJDNode_get_string((*pp_Var7)->next);
              iVar2 = strcmp(pcVar3,anon_var_dwarf_1297c0);
              if ((iVar2 != 0) || (pNVar4 = (*pp_Var7)->next->next, pNVar4 == (NJDNode *)0x0))
              goto LAB_00149611;
              pcVar3 = NJDNode_get_string(pNVar4);
              iVar2 = strcmp(pcVar3,anon_var_dwarf_129772);
              if (iVar2 == 0) {
                NJDNode_load(pNVar8,anon_var_dwarf_12980f);
                p_Var6 = pNVar8->next;
                pcVar3 = anon_var_dwarf_12981a;
              }
              else {
                pcVar3 = NJDNode_get_string((*pp_Var7)->next->next);
                iVar2 = strcmp(pcVar3,anon_var_dwarf_1297aa);
                if (iVar2 != 0) goto LAB_00149611;
                NJDNode_load(pNVar8,anon_var_dwarf_12980f);
                p_Var6 = pNVar8->next;
                pcVar3 = anon_var_dwarf_129831;
              }
              NJDNode_load(p_Var6,pcVar3);
              NJDNode_set_pron(pNVar8->next->next,(char *)0x0);
              pp_Var7 = &pNVar8->next->next;
            }
            NJDNode_set_pron((*pp_Var7)->next,(char *)0x0);
          }
        }
      }
    }
    else {
      pcVar3 = NJDNode_get_pos_group1(pNVar8->prev);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12b2c2 + 9);
      if (iVar2 != 0) goto LAB_00149416;
    }
LAB_00149611:
    pNVar8 = pNVar8->next;
  } while( true );
  while (lVar9 = lVar9 + 8, lVar9 != 0xa0) {
LAB_00148fe4:
    pcVar3 = NJDNode_get_string(p_Var6);
    iVar2 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar9));
    if (iVar2 == 0) {
      NJDNode_set_chain_flag(p_Var6->prev,0);
      iVar2 = 1;
      goto LAB_00149076;
    }
  }
LAB_0014900a:
  lVar9 = 0;
  do {
    pcVar3 = NJDNode_get_string(p_Var6->prev);
    iVar2 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list5 + lVar9));
    if (iVar2 == 0) {
      lVar9 = 0;
      goto LAB_0014903a;
    }
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0xa0);
LAB_00148f19:
  iVar2 = search_numerative_class(njd_set_digit_rule_numeral_list8,p_Var6);
  if (iVar2 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list9,p_Var6->prev);
  }
  iVar2 = search_numerative_class(njd_set_digit_rule_numeral_list10,p_Var6);
  if (iVar2 != 0) {
    convert_digit_pron(njd_set_digit_rule_numeral_list11,p_Var6->prev);
  }
  iVar2 = search_numerative_class(njd_set_digit_rule_numeral_list6,p_Var6);
  if (iVar2 != 0) {
    convert_numerative_pron(njd_set_digit_rule_numeral_list7,p_Var6->prev,p_Var6);
  }
LAB_00148f85:
  p_Var6 = p_Var6->next;
  if (p_Var6 == (_NJDNode *)0x0) goto LAB_00149083;
  goto LAB_00148ee6;
LAB_0014903a:
  pcVar3 = NJDNode_get_string(p_Var6);
  iVar2 = strcmp(pcVar3,*(char **)((long)njd_set_digit_rule_numeral_list4 + lVar9));
  if (iVar2 != 0) goto code_r0x00149053;
  iVar2 = 0;
LAB_00149076:
  NJDNode_set_chain_flag(p_Var6,iVar2);
  goto LAB_00148f19;
code_r0x00149053:
  lVar9 = lVar9 + 8;
  if (lVar9 == 0x60) goto LAB_00148f19;
  goto LAB_0014903a;
  while (lVar9 = lVar9 + 4, lVar9 != 8) {
LAB_001491e7:
    pcVar3 = NJDNode_get_string(p_Var6);
    iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table3[lVar9]);
    if (iVar2 == 0) {
      pcVar3 = njd_set_digit_rule_conv_table3[lVar9 + 1];
      __nptr = njd_set_digit_rule_conv_table3[lVar9 + 2];
      NJDNode_set_read(p_Var6,pcVar3);
      NJDNode_set_pron(p_Var6,pcVar3);
      iVar2 = atoi(__nptr);
      NJDNode_set_acc(p_Var6,iVar2);
      iVar2 = atoi(njd_set_digit_rule_conv_table3[lVar9 + 3]);
      NJDNode_set_mora_size(p_Var6,iVar2);
      break;
    }
  }
LAB_0014919a:
  pcVar3 = NJDNode_get_string(p_Var6->next);
  iVar2 = strcmp(pcVar3,anon_var_dwarf_129767);
  if (iVar2 == 0) {
    lVar9 = 0;
    do {
      pcVar3 = NJDNode_get_string(p_Var6);
      iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar9]);
      if (iVar2 == 0) {
        NJDNode_load(p_Var6,njd_set_digit_rule_conv_table4[lVar9 + 1]);
        NJDNode_set_pron(p_Var6->next,(char *)0x0);
        break;
      }
      lVar9 = lVar9 + 2;
    } while (lVar9 != 4);
  }
  pcVar3 = NJDNode_get_string(p_Var6->next);
  iVar2 = strcmp(pcVar3,anon_var_dwarf_129772);
  if (iVar2 == 0) {
    pcVar3 = NJDNode_get_string(p_Var6);
    iVar2 = strcmp(pcVar3,"*");
    if (iVar2 != 0) {
      if (p_Var6->prev != (NJDNode *)0x0) {
        pcVar3 = NJDNode_get_string(p_Var6->prev);
        pcVar3 = strstr(pcVar3,anon_var_dwarf_12a013 + 3);
        if (pcVar3 != (char *)0x0) {
          pcVar3 = NJDNode_get_string(p_Var6);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_129788);
          if (iVar2 == 0) {
            pcVar3 = anon_var_dwarf_129793;
LAB_001493b3:
            NJDNode_load(p_Var6,pcVar3);
            NJDNode_set_pron(p_Var6->next,(char *)0x0);
            goto LAB_001490d8;
          }
        }
      }
      lVar9 = 1;
      do {
        pcVar3 = NJDNode_get_string(p_Var6);
        iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table4[lVar9 + 5]);
        if (iVar2 == 0) {
          ppcVar5 = njd_set_digit_rule_conv_table5;
          goto LAB_001493ac;
        }
        lVar9 = lVar9 + 2;
      } while (lVar9 != 0x15);
      goto LAB_001490d8;
    }
  }
  pcVar3 = NJDNode_get_string(p_Var6->next);
  iVar2 = strcmp(pcVar3,anon_var_dwarf_1297aa);
  if (iVar2 == 0) {
    lVar9 = 1;
    do {
      pcVar3 = NJDNode_get_string(p_Var6);
      iVar2 = strcmp(pcVar3,njd_set_digit_rule_conv_table5[lVar9 + 0x15]);
      if (iVar2 == 0) {
        ppcVar5 = njd_set_digit_rule_conv_table6;
LAB_001493ac:
        pcVar3 = ppcVar5[lVar9];
        goto LAB_001493b3;
      }
      lVar9 = lVar9 + 2;
    } while (lVar9 != 0x15);
  }
LAB_001490d8:
  p_Var6 = p_Var6->next;
  if (p_Var6 == (_NJDNode *)0x0) goto LAB_001493d4;
  goto LAB_001490a4;
}

Assistant:

void njd_set_digit(NJD * njd)
{
   int i, j;
   NJDNode *s = NULL;
   NJDNode *e = NULL;
   NJDNode *node;
   int find = 0;

   /* convert digit sequence */
   for (node = njd->head; node != NULL; node = node->next) {
      if (find == 0 && strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
         find = 1;
      if (get_digit(node, 1) >= 0 ||
          (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
           (is_period(NJDNode_get_string(node)) == 1 || is_comma(NJDNode_get_string(node)) == 1)
          )) {
         if (s == NULL)
            s = node;
         if (node == njd->tail)
            e = node;
      } else {
         if (s != NULL)
            e = node->prev;
      }
      if (s != NULL && e != NULL) {
         convert_digit_sequence(njd, s, e);
         s = e = NULL;
      }
   }
   if (find == 0)
      return;
   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL && node->next != NULL;) {
      if (strcmp(NJDNode_get_string(node), "*") != 0
          && strcmp(NJDNode_get_string(node->prev), "*") != 0
          && is_period(NJDNode_get_string(node)) == 1
          && strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0
          && strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_KAZU) == 0) {
         NJDNode_load(node, NJD_SET_DIGIT_TEN_FEATURE);
         NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO1) == 0
             || strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_ZERO2) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_ZERO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_TWO) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_TWO_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_FIVE) == 0) {
            NJDNode_set_pron(node->prev, NJD_SET_DIGIT_FIVE_BEFORE_DP);
            NJDNode_set_mora_size(node->prev, 2);
         } else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_DIGIT_SIX) == 0) {
            NJDNode_set_acc(node->prev, 1);
         }
         /* skip digit sequence */
         node = node->next;
         while (node && strcmp(NJDNode_get_pos(node), NJD_SET_DIGIT_MEISHI) == 0)
            node = node->next;
         if (node)
            node = node->next;
      } else {
         node = node->next;
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group2(node), NJD_SET_DIGIT_JOSUUSHI) == 0
             || strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_FUKUSHIKANOU) == 0) {
            /* convert digit pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class1b, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1b, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c1, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c1, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1c2, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1c2, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1d, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1d, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1e, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1e, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1f, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1f, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1g, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1g, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1h, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1h, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1i, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1i, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1j, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1j, node->prev);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class1k, node) == 1)
               convert_digit_pron(njd_set_digit_rule_conv_table1k, node->prev);
            /* convert numerative pron */
            if (search_numerative_class(njd_set_digit_rule_numerative_class2b, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2b, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2c, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2c, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2d, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2d, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2e, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2e, node->prev, node);
            else if (search_numerative_class(njd_set_digit_rule_numerative_class2f, node) == 1)
               convert_numerative_pron(njd_set_digit_rule_conv_table2f, node->prev, node);
            /* modify accent phrase */
            NJDNode_set_chain_flag(node->prev, 0);
            NJDNode_set_chain_flag(node, 1);
         }
      }
   }

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) == 0) {
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0
             && NJDNode_get_string(node->prev) != NULL && NJDNode_get_string(node) != NULL) {
            /* modify accent phrase */
            find = 0;
            for (i = 0; njd_set_digit_rule_numeral_list4[i] != NULL; i++) {
               if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list4[i]) == 0) {
                  for (j = 0; njd_set_digit_rule_numeral_list5[j] != NULL; j++) {
                     if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list5[j]) == 0) {
                        NJDNode_set_chain_flag(node->prev, 0);
                        NJDNode_set_chain_flag(node, 1);
                        find = 1;
                        break;
                     }
                  }
                  break;
               }
            }
            if (find == 0) {
               for (i = 0; njd_set_digit_rule_numeral_list5[i] != NULL; i++) {
                  if (strcmp(NJDNode_get_string(node->prev), njd_set_digit_rule_numeral_list5[i]) ==
                      0) {
                     for (j = 0; njd_set_digit_rule_numeral_list4[j] != NULL; j++) {
                        if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_numeral_list4[j]) ==
                            0) {
                           NJDNode_set_chain_flag(node, 0);
                           break;
                        }
                     }
                     break;
                  }
               }
            }
         }
         if (search_numerative_class(njd_set_digit_rule_numeral_list8, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list9, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list10, node) == 1)
            convert_digit_pron(njd_set_digit_rule_numeral_list11, node->prev);
         if (search_numerative_class(njd_set_digit_rule_numeral_list6, node) == 1)
            convert_numerative_pron(njd_set_digit_rule_numeral_list7, node->prev, node);
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL &&
          strcmp(NJDNode_get_string(node->next), "*") != 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0 &&
          (node->prev == NULL
           || strcmp(NJDNode_get_pos(node->prev), NJD_SET_DIGIT_KIGOU) == 0
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && (strcmp(NJDNode_get_pos_group2(node->next), NJD_SET_DIGIT_JOSUUSHI) == 0
              || strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_DIGIT_FUKUSHIKANOU) == 0)) {
         /* convert class3 */
         for (i = 0; njd_set_digit_rule_numerative_class3[i] != NULL; i += 2) {
            if (strcmp(NJDNode_get_string(node->next), njd_set_digit_rule_numerative_class3[i]) == 0
                && strcmp(NJDNode_get_read(node->next),
                          njd_set_digit_rule_numerative_class3[i + 1]) == 0) {
               for (j = 0; njd_set_digit_rule_conv_table3[j] != NULL; j += 4) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table3[j]) == 0) {
                     NJDNode_set_read(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_pron(node, (char *) njd_set_digit_rule_conv_table3[j + 1]);
                     NJDNode_set_acc(node, atoi(njd_set_digit_rule_conv_table3[j + 2]));
                     NJDNode_set_mora_size(node, atoi(njd_set_digit_rule_conv_table3[j + 3]));
                     break;
                  }
               }
               break;
            }
         }
         /* person */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NIN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table4[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table4[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table4[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
         /* the day of month */
         if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHI) == 0
             && strcmp(NJDNode_get_string(node), "*") != 0) {
            if (node->prev != NULL
                && strstr(NJDNode_get_string(node->prev), NJD_SET_DIGIT_GATSU) != NULL
                && strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ONE) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_TSUITACHI);
               NJDNode_set_pron(node->next, NULL);
            } else {
               for (i = 0; njd_set_digit_rule_conv_table5[i] != NULL; i += 2) {
                  if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table5[i]) == 0) {
                     NJDNode_load(node, (char *) njd_set_digit_rule_conv_table5[i + 1]);
                     NJDNode_set_pron(node->next, NULL);
                     break;
                  }
               }
            }
         } else if (strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
            for (i = 0; njd_set_digit_rule_conv_table6[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_digit_rule_conv_table6[i]) == 0) {
                  NJDNode_load(node, (char *) njd_set_digit_rule_conv_table6[i + 1]);
                  NJDNode_set_pron(node->next, NULL);
                  break;
               }
            }
         }
      }
   }

   for (node = njd->head; node != NULL; node = node->next) {
      if ((node->prev == NULL
           || strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_DIGIT_KAZU) != 0)
          && node->next != NULL && node->next->next != NULL) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TEN) == 0
             && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_FOUR) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_JUYOKKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TWO) == 0
                    && strcmp(NJDNode_get_string(node->next), NJD_SET_DIGIT_TEN) == 0) {
            if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHI) == 0) {
               NJDNode_load(node, NJD_SET_DITIT_HATSUKA);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_NICHIKAN) == 0) {
               NJDNode_load(node, NJD_SET_DIGIT_HATSUKAKAN);
               NJDNode_set_pron(node->next, NULL);
               NJDNode_set_pron(node->next->next, NULL);
            } else if (strcmp(NJDNode_get_string(node->next->next), NJD_SET_DIGIT_FOUR) == 0
                       && node->next->next->next != NULL) {
               if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHI) == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DITIT_YOKKA);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               } else if (strcmp(NJDNode_get_string(node->next->next->next), NJD_SET_DIGIT_NICHIKAN)
                          == 0) {
                  NJDNode_load(node, NJD_SET_DIGIT_NIJU);
                  NJDNode_load(node->next, NJD_SET_DIGIT_YOKKAKAN);
                  NJDNode_set_pron(node->next->next, NULL);
                  NJDNode_set_pron(node->next->next->next, NULL);
               }
            }
         }
      }
   }

   NJD_remove_silent_node(njd);
   if (njd->head == NULL)
      return;
}